

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall lzham::lzcompressor::flush(lzcompressor *this,lzham_flush_t flush_type)

{
  uint buf_len;
  bool bVar1;
  
  if (this->m_finished == false) {
    buf_len = (this->m_block_buf).m_size;
    if (buf_len == 0) {
      bVar1 = true;
    }
    else {
      bVar1 = compress_block(this,(this->m_block_buf).m_p,buf_len);
      if ((this->m_block_buf).m_size != 0) {
        (this->m_block_buf).m_size = 0;
      }
    }
    if (bVar1 != false) {
      bVar1 = send_sync_block(this,flush_type);
      if (flush_type == LZHAM_FULL_FLUSH) {
        search_accelerator::flush(&this->m_accel);
        state::reset(&this->m_state);
      }
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool lzcompressor::flush(lzham_flush_t flush_type)
   {
      LZHAM_ASSERT(!m_finished);
      if (m_finished)
      {
         LZHAM_LOG_ERROR(7023);
         return false;
      }

      bool status = true;
      if (m_block_buf.size())
      {
         status = compress_block(m_block_buf.get_ptr(), m_block_buf.size());

         m_block_buf.try_resize(0);
      }

      if (status)
      {
         status = send_sync_block(flush_type);

         if (LZHAM_FULL_FLUSH == flush_type)
         {
            m_accel.flush();
            m_state.reset();
         }
      }

      lzham_flush_buffered_printf();

      return status;
   }